

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp,char *emsg)

{
  bool bVar1;
  cv_status cVar2;
  id tid;
  system_error *this_00;
  error_category *peVar3;
  error_code __ec;
  unique_lock<std::mutex> lk;
  
  tid._M_thread = pthread_self();
  std::unique_lock<std::mutex>::unique_lock
            (&lk,&(this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).mtx_);
  if ((this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).e_owner_._M_thread !=
      tid._M_thread) {
    bVar1 = detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::is_shared_owner
                      (&this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>,tid);
    if (!bVar1) {
      do {
        if ((this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).state_.rwcount == 0)
        goto LAB_0011820a;
        cVar2 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          (&(this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).cv_,&lk,tp);
      } while (cVar2 != timeout);
      if ((this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).state_.rwcount == 0) {
LAB_0011820a:
        rwlock::ReaderPrefer::acquire_wlock((state *)this);
        (this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).e_owner_._M_thread =
             tid._M_thread;
        bVar1 = true;
        validator::deadlock::locked((uintptr_t)this,tid,false);
      }
      else {
        bVar1 = false;
      }
      std::unique_lock<std::mutex>::~unique_lock(&lk);
      return bVar1;
    }
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar3 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar3;
  __ec._0_8_ = 0x23;
  std::system_error::system_error(this_00,__ec,emsg);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp, const char* emsg)
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || base::is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
      (void)emsg; // suppress "unused variable" warning
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), emsg);
#endif
    }
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    e_owner_ = tid;
    detail::validator::locked(reinterpret_cast<uintptr_t>(this), tid, false);
    return true;
  }